

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationDataBuilder::addCE32
          (CollationDataBuilder *this,uint32_t ce32,UErrorCode *errorCode)

{
  int32_t iVar1;
  uint32_t uVar2;
  int32_t local_30;
  int32_t i;
  int32_t length;
  UErrorCode *errorCode_local;
  uint32_t ce32_local;
  CollationDataBuilder *this_local;
  
  iVar1 = UVector32::size(&this->ce32s);
  local_30 = 0;
  while( true ) {
    if (iVar1 <= local_30) {
      UVector32::addElement(&this->ce32s,ce32,errorCode);
      return iVar1;
    }
    uVar2 = UVector32::elementAti(&this->ce32s,local_30);
    if (ce32 == uVar2) break;
    local_30 = local_30 + 1;
  }
  return local_30;
}

Assistant:

int32_t
CollationDataBuilder::addCE32(uint32_t ce32, UErrorCode &errorCode) {
    int32_t length = ce32s.size();
    for(int32_t i = 0; i < length; ++i) {
        if(ce32 == (uint32_t)ce32s.elementAti(i)) { return i; }
    }
    ce32s.addElement((int32_t)ce32, errorCode);  
    return length;
}